

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O1

void hydro_random_ratchet(void)

{
  uchar *dst;
  long *in_FS_OFFSET;
  
  in_FS_OFFSET[-8] = 0;
  in_FS_OFFSET[-7] = 0;
  in_FS_OFFSET[-8] = in_FS_OFFSET[-2];
  in_FS_OFFSET[-2] = in_FS_OFFSET[-2] + 1;
  gimli_core_u8((uint8_t *)(*in_FS_OFFSET + -0x40),'\0');
  *(undefined1 *)((long)in_FS_OFFSET + -7) = 0x10;
  return;
}

Assistant:

void
hydro_random_ratchet(void)
{
    mem_zero(hydro_random_context.state, gimli_RATE);
    STORE64_LE(hydro_random_context.state, hydro_random_context.counter);
    hydro_random_context.counter++;
    gimli_core_u8(hydro_random_context.state, 0);
    hydro_random_context.available = gimli_RATE;
}